

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_glnodes.cpp
# Opt level: O3

bool P_CheckNodes(MapData *map,bool rebuilt,int buildtime)

{
  float fVar1;
  undefined4 uVar2;
  fixed_t fVar3;
  void *pvVar4;
  vertex_t *pvVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  undefined4 *__ptr;
  FILE *__s;
  size_t sVar9;
  long lVar10;
  long lVar11;
  line_t_conflict *plVar12;
  undefined1 uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  undefined7 in_register_00000031;
  bool bVar17;
  bool bVar18;
  long lVar19;
  bool bVar20;
  double dVar21;
  undefined1 auVar22 [16];
  TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> polyspots;
  FNodeBuilder builder;
  long local_90;
  TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> anchors;
  uLongf outlen;
  int local_68;
  side_t *local_60;
  int local_58;
  line_t_conflict *local_50;
  int local_48;
  undefined8 local_44;
  undefined8 uStack_3c;
  
  if ((int)CONCAT71(in_register_00000031,rebuilt) == 0) {
    bVar20 = P_CheckForGLNodes();
    if (bVar20) {
      bVar17 = false;
    }
    else {
      if (0 < (long)numsubsectors) {
        lVar8 = 0;
        do {
          *(undefined8 *)((long)&gamesubsectors->sector + lVar8) =
               **(undefined8 **)(*(long *)((long)&gamesubsectors->firstline + lVar8) + 0x10);
          lVar8 = lVar8 + 0x30;
        } while ((long)numsubsectors * 0x30 != lVar8);
      }
      nodes = (node_t *)0x0;
      numnodes = 0;
      subsectors = (subsector_t *)0x0;
      numsubsectors = 0;
      if (segs != (seg_t *)0x0) {
        operator_delete__(segs);
      }
      segs = (seg_t *)0x0;
      numsegs = 0;
      bVar20 = P_LoadGLNodes(map);
      bVar17 = true;
      if (bVar20) goto LAB_003fb38b;
      uVar14 = I_FPSTime();
      polyspots.Array = (FPolyStart *)0x0;
      polyspots.Most = 0;
      polyspots.Count = 0;
      anchors.Array = (FPolyStart *)0x0;
      anchors.Most = 0;
      anchors.Count = 0;
      P_GetPolySpots(map,&polyspots,&anchors);
      outlen = (uLongf)vertexes;
      local_68 = numvertexes;
      local_60 = sides;
      local_58 = numsides;
      local_50 = lines;
      local_48 = numlines;
      local_44._0_4_ = 0;
      local_44._4_4_ = 0;
      uStack_3c._0_4_ = 0;
      uStack_3c._4_4_ = 0;
      FNodeBuilder::FLevel::FindMapBounds((FLevel *)&outlen);
      FNodeBuilder::FNodeBuilder(&builder,(FLevel *)&outlen,&polyspots,&anchors,true);
      if (vertexes != (vertex_t *)0x0) {
        operator_delete__(vertexes);
      }
      FNodeBuilder::Extract
                (&builder,&nodes,&numnodes,&segs,&glsegextras,&numsegs,&subsectors,&numsubsectors,
                 &vertexes,&numvertexes);
      uVar6 = I_FPSTime();
      buildtime = uVar6 - uVar14;
      bVar17 = true;
      DPrintf(3,"BSP generation took %.3f sec (%d segs)\n",(double)(uint)buildtime * 0.001,
              (ulong)(uint)numsegs);
      FNodeBuilder::~FNodeBuilder(&builder);
      TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart>::~TArray(&anchors);
      TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart>::~TArray(&polyspots);
    }
  }
  else {
    bVar17 = false;
  }
  if (((level.maptype == MAPTYPE_BUILD) || (gl_cachenodes.Value != true)) ||
     ((float)buildtime / 1000.0 < gl_cachetime.Value)) {
    DPrintf(3,"Not caching nodes (time = %f)\n",(double)((float)buildtime / 1000.0));
  }
  else {
    DPrintf(3,"Caching nodes\n");
    builder.VertexMap = (IVertexMap *)0x0;
    builder.OldVertexTable = (int *)0x0;
    TArray<unsigned_char,_unsigned_char>::Grow((TArray<unsigned_char,_unsigned_char> *)&builder,4);
    lVar8 = (long)(int)builder.OldVertexTable._4_4_;
    builder.OldVertexTable =
         (int *)CONCAT44(builder.OldVertexTable._4_4_ + 4,builder.OldVertexTable._0_4_);
    *(undefined1 *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar8) = 0;
    *(undefined1 *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar8 + 1) = 0;
    *(undefined1 *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar8 + 2) = 0;
    *(undefined1 *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar8 + 3) = 0;
    iVar7 = numvertexes;
    TArray<unsigned_char,_unsigned_char>::Grow((TArray<unsigned_char,_unsigned_char> *)&builder,4);
    lVar8 = (long)(int)builder.OldVertexTable._4_4_;
    builder.OldVertexTable =
         (int *)CONCAT44(builder.OldVertexTable._4_4_ + 4,builder.OldVertexTable._0_4_);
    *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar8) = (char)iVar7;
    *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar8 + 1) = (char)((uint)iVar7 >> 8);
    *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar8 + 2) =
         (char)((uint)iVar7 >> 0x10);
    *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar8 + 3) =
         (char)((uint)iVar7 >> 0x18);
    if (0 < numvertexes) {
      lVar19 = 0;
      lVar8 = 0;
      do {
        dVar21 = *(double *)((long)&(vertexes->p).X + lVar19);
        TArray<unsigned_char,_unsigned_char>::Grow
                  ((TArray<unsigned_char,_unsigned_char> *)&builder,4);
        dVar21 = dVar21 + 103079215104.0;
        lVar10 = (long)(int)builder.OldVertexTable._4_4_;
        builder.OldVertexTable =
             (int *)CONCAT44(builder.OldVertexTable._4_4_ + 4,builder.OldVertexTable._0_4_);
        *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar10) = SUB81(dVar21,0);
        *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar10 + 1) =
             (char)((ulong)dVar21 >> 8);
        *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar10 + 2) =
             (char)((ulong)dVar21 >> 0x10);
        *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar10 + 3) =
             (char)((ulong)dVar21 >> 0x18);
        dVar21 = *(double *)((long)&(vertexes->p).Y + lVar19);
        TArray<unsigned_char,_unsigned_char>::Grow
                  ((TArray<unsigned_char,_unsigned_char> *)&builder,4);
        dVar21 = dVar21 + 103079215104.0;
        lVar10 = (long)(int)builder.OldVertexTable._4_4_;
        builder.OldVertexTable =
             (int *)CONCAT44(builder.OldVertexTable._4_4_ + 4,builder.OldVertexTable._0_4_);
        *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar10) = SUB81(dVar21,0);
        *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar10 + 1) =
             (char)((ulong)dVar21 >> 8);
        *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar10 + 2) =
             (char)((ulong)dVar21 >> 0x10);
        *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar10 + 3) =
             (char)((ulong)dVar21 >> 0x18);
        lVar8 = lVar8 + 1;
        lVar19 = lVar19 + 0x10;
      } while (lVar8 < numvertexes);
    }
    iVar7 = numsubsectors;
    TArray<unsigned_char,_unsigned_char>::Grow((TArray<unsigned_char,_unsigned_char> *)&builder,4);
    lVar8 = (long)(int)builder.OldVertexTable._4_4_;
    builder.OldVertexTable =
         (int *)CONCAT44(builder.OldVertexTable._4_4_ + 4,builder.OldVertexTable._0_4_);
    *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar8) = (char)iVar7;
    *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar8 + 1) = (char)((uint)iVar7 >> 8);
    *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar8 + 2) =
         (char)((uint)iVar7 >> 0x10);
    *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar8 + 3) =
         (char)((uint)iVar7 >> 0x18);
    if (0 < numsubsectors) {
      lVar19 = 0x28;
      lVar8 = 0;
      do {
        uVar2 = *(undefined4 *)((long)&subsectors->sector + lVar19);
        TArray<unsigned_char,_unsigned_char>::Grow
                  ((TArray<unsigned_char,_unsigned_char> *)&builder,4);
        lVar10 = (long)(int)builder.OldVertexTable._4_4_;
        builder.OldVertexTable =
             (int *)CONCAT44(builder.OldVertexTable._4_4_ + 4,builder.OldVertexTable._0_4_);
        *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar10) = (char)uVar2;
        *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar10 + 1) =
             (char)((uint)uVar2 >> 8);
        *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar10 + 2) =
             (char)((uint)uVar2 >> 0x10);
        *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar10 + 3) =
             (char)((uint)uVar2 >> 0x18);
        lVar8 = lVar8 + 1;
        lVar19 = lVar19 + 0x30;
      } while (lVar8 < numsubsectors);
    }
    iVar7 = numsegs;
    TArray<unsigned_char,_unsigned_char>::Grow((TArray<unsigned_char,_unsigned_char> *)&builder,4);
    lVar8 = (long)(int)builder.OldVertexTable._4_4_;
    builder.OldVertexTable =
         (int *)CONCAT44(builder.OldVertexTable._4_4_ + 4,builder.OldVertexTable._0_4_);
    *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar8) = (char)iVar7;
    *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar8 + 1) = (char)((uint)iVar7 >> 8);
    *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar8 + 2) =
         (char)((uint)iVar7 >> 0x10);
    *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar8 + 3) =
         (char)((uint)iVar7 >> 0x18);
    if (0 < numsegs) {
      lVar10 = 0;
      lVar19 = 0;
      lVar8 = 0;
      do {
        pvVar5 = vertexes;
        lVar11 = *(long *)((long)&segs->v1 + lVar19);
        TArray<unsigned_char,_unsigned_char>::Grow
                  ((TArray<unsigned_char,_unsigned_char> *)&builder,4);
        uVar15 = lVar11 - (long)pvVar5;
        lVar11 = (long)(int)builder.OldVertexTable._4_4_;
        builder.OldVertexTable =
             (int *)CONCAT44(builder.OldVertexTable._4_4_ + 4,builder.OldVertexTable._0_4_);
        *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar11) = (char)(uVar15 >> 4);
        *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar11 + 1) = (char)(uVar15 >> 0xc)
        ;
        *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar11 + 2) =
             (char)(uVar15 >> 0x14);
        *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar11 + 3) =
             (char)(uVar15 >> 0x1c);
        if (glsegextras == (glsegextra_t *)0x0) {
          TArray<unsigned_char,_unsigned_char>::Grow
                    ((TArray<unsigned_char,_unsigned_char> *)&builder,4);
          lVar11 = (long)(int)builder.OldVertexTable._4_4_;
          builder.OldVertexTable =
               (int *)CONCAT44(builder.OldVertexTable._4_4_ + 4,builder.OldVertexTable._0_4_);
          uVar13 = 0;
          *(undefined1 *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar11) = 0;
          *(undefined1 *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar11 + 1) = 0;
          *(undefined1 *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar11 + 2) = 0;
        }
        else {
          uVar2 = *(undefined4 *)((long)&glsegextras->PartnerSeg + lVar10);
          TArray<unsigned_char,_unsigned_char>::Grow
                    ((TArray<unsigned_char,_unsigned_char> *)&builder,4);
          lVar11 = (long)(int)builder.OldVertexTable._4_4_;
          builder.OldVertexTable =
               (int *)CONCAT44(builder.OldVertexTable._4_4_ + 4,builder.OldVertexTable._0_4_);
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar11) = (char)uVar2;
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar11 + 1) =
               (char)((uint)uVar2 >> 8);
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar11 + 2) =
               (char)((uint)uVar2 >> 0x10);
          uVar13 = (undefined1)((uint)uVar2 >> 0x18);
        }
        *(undefined1 *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar11 + 3) = uVar13;
        plVar12 = lines;
        lVar11 = *(long *)((long)&segs->linedef + lVar19);
        if (lVar11 == 0) {
          TArray<unsigned_char,_unsigned_char>::Grow
                    ((TArray<unsigned_char,_unsigned_char> *)&builder,4);
          lVar11 = (long)(int)builder.OldVertexTable._4_4_;
          builder.OldVertexTable =
               (int *)CONCAT44(builder.OldVertexTable._4_4_ + 4,builder.OldVertexTable._0_4_);
          *(undefined1 *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar11) = 0xff;
          *(undefined1 *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar11 + 1) = 0xff;
          *(undefined1 *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar11 + 2) = 0xff;
          *(undefined1 *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar11 + 3) = 0xff;
          TArray<unsigned_char,_unsigned_char>::Grow
                    ((TArray<unsigned_char,_unsigned_char> *)&builder,1);
          bVar20 = false;
        }
        else {
          TArray<unsigned_char,_unsigned_char>::Grow
                    ((TArray<unsigned_char,_unsigned_char> *)&builder,4);
          lVar16 = (lVar11 - (long)plVar12 >> 3) * -0x79435e50d79435e5;
          lVar11 = (long)(int)builder.OldVertexTable._4_4_;
          builder.OldVertexTable =
               (int *)CONCAT44(builder.OldVertexTable._4_4_ + 4,builder.OldVertexTable._0_4_);
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar11) = (char)lVar16;
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar11 + 1) =
               (char)((ulong)lVar16 >> 8);
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar11 + 2) =
               (char)((ulong)lVar16 >> 0x10);
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar11 + 3) =
               (char)((ulong)lVar16 >> 0x18);
          lVar11 = *(long *)((long)&segs->sidedef + lVar19);
          lVar16 = *(long *)(*(long *)((long)&segs->linedef + lVar19) + 0x48);
          TArray<unsigned_char,_unsigned_char>::Grow
                    ((TArray<unsigned_char,_unsigned_char> *)&builder,1);
          bVar20 = lVar11 != lVar16;
        }
        *(bool *)((long)&(builder.VertexMap)->_vptr_IVertexMap + (ulong)builder.OldVertexTable._4_4_
                 ) = bVar20;
        builder.OldVertexTable =
             (int *)CONCAT44(builder.OldVertexTable._4_4_ + 1,builder.OldVertexTable._0_4_);
        lVar8 = lVar8 + 1;
        lVar19 = lVar19 + 0x30;
        lVar10 = lVar10 + 0x10;
      } while (lVar8 < numsegs);
    }
    iVar7 = numnodes;
    TArray<unsigned_char,_unsigned_char>::Grow((TArray<unsigned_char,_unsigned_char> *)&builder,4);
    lVar8 = (long)(int)builder.OldVertexTable._4_4_;
    builder.OldVertexTable =
         (int *)CONCAT44(builder.OldVertexTable._4_4_ + 4,builder.OldVertexTable._0_4_);
    *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar8) = (char)iVar7;
    *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar8 + 1) = (char)((uint)iVar7 >> 8);
    *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar8 + 2) =
         (char)((uint)iVar7 >> 0x10);
    *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar8 + 3) =
         (char)((uint)iVar7 >> 0x18);
    if (0 < numnodes) {
      local_90 = 0x10;
      lVar8 = 0;
      do {
        fVar3 = nodes[lVar8].x;
        TArray<unsigned_char,_unsigned_char>::Grow
                  ((TArray<unsigned_char,_unsigned_char> *)&builder,4);
        lVar19 = (long)(int)builder.OldVertexTable._4_4_;
        builder.OldVertexTable =
             (int *)CONCAT44(builder.OldVertexTable._4_4_ + 4,builder.OldVertexTable._0_4_);
        *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar19) = (char)fVar3;
        *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar19 + 1) =
             (char)((uint)fVar3 >> 8);
        *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar19 + 2) =
             (char)((uint)fVar3 >> 0x10);
        *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar19 + 3) =
             (char)((uint)fVar3 >> 0x18);
        fVar3 = nodes[lVar8].y;
        TArray<unsigned_char,_unsigned_char>::Grow
                  ((TArray<unsigned_char,_unsigned_char> *)&builder,4);
        lVar19 = (long)(int)builder.OldVertexTable._4_4_;
        builder.OldVertexTable =
             (int *)CONCAT44(builder.OldVertexTable._4_4_ + 4,builder.OldVertexTable._0_4_);
        *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar19) = (char)fVar3;
        *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar19 + 1) =
             (char)((uint)fVar3 >> 8);
        *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar19 + 2) =
             (char)((uint)fVar3 >> 0x10);
        *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar19 + 3) =
             (char)((uint)fVar3 >> 0x18);
        fVar3 = nodes[lVar8].dx;
        TArray<unsigned_char,_unsigned_char>::Grow
                  ((TArray<unsigned_char,_unsigned_char> *)&builder,4);
        lVar19 = (long)(int)builder.OldVertexTable._4_4_;
        builder.OldVertexTable =
             (int *)CONCAT44(builder.OldVertexTable._4_4_ + 4,builder.OldVertexTable._0_4_);
        *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar19) = (char)fVar3;
        *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar19 + 1) =
             (char)((uint)fVar3 >> 8);
        *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar19 + 2) =
             (char)((uint)fVar3 >> 0x10);
        *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar19 + 3) =
             (char)((uint)fVar3 >> 0x18);
        fVar3 = nodes[lVar8].dy;
        TArray<unsigned_char,_unsigned_char>::Grow
                  ((TArray<unsigned_char,_unsigned_char> *)&builder,4);
        lVar19 = (long)(int)builder.OldVertexTable._4_4_;
        builder.OldVertexTable =
             (int *)CONCAT44(builder.OldVertexTable._4_4_ + 4,builder.OldVertexTable._0_4_);
        *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar19) = (char)fVar3;
        *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar19 + 1) =
             (char)((uint)fVar3 >> 8);
        *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar19 + 2) =
             (char)((uint)fVar3 >> 0x10);
        *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar19 + 3) =
             (char)((uint)fVar3 >> 0x18);
        lVar19 = 0;
        bVar20 = true;
        do {
          bVar18 = bVar20;
          lVar10 = 0;
          do {
            fVar1 = *(float *)((long)&nodes->x + lVar10 * 4 + lVar19 * 0x10 + local_90);
            TArray<unsigned_char,_unsigned_char>::Grow
                      ((TArray<unsigned_char,_unsigned_char> *)&builder,2);
            iVar7 = (int)fVar1;
            lVar11 = (long)(int)builder.OldVertexTable._4_4_;
            builder.OldVertexTable =
                 (int *)CONCAT44(builder.OldVertexTable._4_4_ + 2,builder.OldVertexTable._0_4_);
            *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar11) = (char)iVar7;
            *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar11 + 1) =
                 (char)((uint)iVar7 >> 8);
            lVar10 = lVar10 + 1;
          } while (lVar10 != 4);
          lVar19 = 1;
          bVar20 = false;
        } while (bVar18);
        lVar19 = 0;
        bVar20 = true;
        do {
          bVar18 = bVar20;
          pvVar4 = nodes[lVar8].field_6.children[lVar19];
          if (((ulong)pvVar4 & 1) == 0) {
            uVar14 = (int)((ulong)((long)pvVar4 - (long)nodes) >> 3) * 0x38e38e39;
          }
          else {
            uVar14 = (int)(~(ulong)subsectors + (long)pvVar4 >> 4) * -0x55555555 | 0x80000000;
          }
          TArray<unsigned_char,_unsigned_char>::Grow
                    ((TArray<unsigned_char,_unsigned_char> *)&builder,4);
          lVar19 = (long)(int)builder.OldVertexTable._4_4_;
          builder.OldVertexTable =
               (int *)CONCAT44(builder.OldVertexTable._4_4_ + 4,builder.OldVertexTable._0_4_);
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar19) = (char)uVar14;
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar19 + 1) = (char)(uVar14 >> 8)
          ;
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar19 + 2) =
               (char)(uVar14 >> 0x10);
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + lVar19 + 3) =
               (char)(uVar14 >> 0x18);
          lVar19 = 1;
          bVar20 = false;
        } while (bVar18);
        lVar8 = lVar8 + 1;
        local_90 = local_90 + 0x48;
      } while (lVar8 < numnodes);
    }
    outlen = (ulong)builder.OldVertexTable >> 0x20;
    lVar19 = (long)numlines;
    lVar8 = lVar19 * 8 + 0x1c;
    while( true ) {
      __ptr = (undefined4 *)operator_new__(outlen + lVar8);
      iVar7 = compress(__ptr + lVar19 * 2 + 7,&outlen,builder.VertexMap,builder.OldVertexTable._4_4_
                      );
      if (iVar7 != -5) break;
      operator_delete__(__ptr);
      outlen = outlen + 0x400;
    }
    *__ptr = 0x48434143;
    __ptr[1] = numlines;
    MapData::GetChecksum(map,(BYTE *)(__ptr + 2));
    pvVar5 = vertexes;
    lVar10 = (long)numlines;
    if (0 < lVar10) {
      auVar22._8_4_ = (int)vertexes;
      auVar22._0_8_ = vertexes;
      auVar22._12_4_ = (int)((ulong)vertexes >> 0x20);
      lVar11 = 0;
      plVar12 = lines;
      do {
        *(ulong *)(__ptr + lVar11 * 2 + 6) =
             CONCAT44((int)((ulong)((long)plVar12->v2 - auVar22._8_8_) >> 4),
                      (int)((ulong)((long)plVar12->v1 - (long)pvVar5) >> 4));
        lVar11 = lVar11 + 1;
        plVar12 = plVar12 + 1;
      } while (lVar10 != lVar11);
    }
    (__ptr + lVar19 * 2 + 7)[-1] = 0x334c475a;
    CreateCacheName((MapData *)&polyspots,SUB81(map,0));
    __s = fopen((char *)polyspots.Array,"wb");
    if (__s == (FILE *)0x0) {
      Printf("Cannot open nodes file %s for writing\n",polyspots.Array);
    }
    else {
      sVar9 = fwrite(__ptr,lVar8 + outlen,1,__s);
      if (sVar9 != 1) {
        Printf("Error saving nodes to file %s\n",polyspots.Array);
      }
      fclose(__s);
    }
    operator_delete__(__ptr);
    FString::~FString((FString *)&polyspots);
    TArray<unsigned_char,_unsigned_char>::~TArray((TArray<unsigned_char,_unsigned_char> *)&builder);
  }
LAB_003fb38b:
  if (gamenodes == (node_t *)0x0) {
    gamenodes = nodes;
    numgamenodes = numnodes;
    gamesubsectors = subsectors;
    numgamesubsectors = numsubsectors;
  }
  return bVar17;
}

Assistant:

bool P_CheckNodes(MapData * map, bool rebuilt, int buildtime)
{
	bool ret = false;
	bool loaded = false;

	// If the map loading code has performed a node rebuild we don't need to check for it again.
	if (!rebuilt && !P_CheckForGLNodes())
	{
		ret = true;	// we are not using the level's original nodes if we get here.
		for (int i = 0; i < numsubsectors; i++)
		{
			gamesubsectors[i].sector = gamesubsectors[i].firstline->sidedef->sector;
		}

		nodes = NULL;
		numnodes = 0;
		subsectors = NULL;
		numsubsectors = 0;
		if (segs) delete [] segs;
		segs = NULL;
		numsegs = 0;

		// Try to load GL nodes (cached or GWA)
		loaded = P_LoadGLNodes(map);
		if (!loaded)
		{
			// none found - we have to build new ones!
			unsigned int startTime, endTime;

			startTime = I_FPSTime ();
			TArray<FNodeBuilder::FPolyStart> polyspots, anchors;
			P_GetPolySpots (map, polyspots, anchors);
			FNodeBuilder::FLevel leveldata =
			{
				vertexes, numvertexes,
				sides, numsides,
				lines, numlines,
				0, 0, 0, 0
			};
			leveldata.FindMapBounds ();
			FNodeBuilder builder (leveldata, polyspots, anchors, true);
			delete[] vertexes;
			builder.Extract (nodes, numnodes,
				segs, glsegextras, numsegs,
				subsectors, numsubsectors,
				vertexes, numvertexes);
			endTime = I_FPSTime ();
			DPrintf (DMSG_NOTIFY, "BSP generation took %.3f sec (%d segs)\n", (endTime - startTime) * 0.001, numsegs);
			buildtime = endTime - startTime;
		}
	}

	if (!loaded)
	{
#ifdef DEBUG
		// Building nodes in debug is much slower so let's cache them only if cachetime is 0
		buildtime = 0;
#endif
		if (level.maptype != MAPTYPE_BUILD && gl_cachenodes && buildtime/1000.f >= gl_cachetime)
		{
			DPrintf(DMSG_NOTIFY, "Caching nodes\n");
			CreateCachedNodes(map);
		}
		else
		{
			DPrintf(DMSG_NOTIFY, "Not caching nodes (time = %f)\n", buildtime/1000.f);
		}
	}

	if (!gamenodes)
	{
		gamenodes = nodes;
		numgamenodes = numnodes;
		gamesubsectors = subsectors;
		numgamesubsectors = numsubsectors;
	}
	return ret;
}